

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

int traverseLclosure(global_State *g,LClosure *cl)

{
  UpVal *o;
  UpVal *uv;
  int i;
  LClosure *cl_local;
  global_State *g_local;
  
  if ((cl->p != (Proto *)0x0) && ((cl->p->marked & 0x18) != 0)) {
    reallymarkobject(g,(GCObject *)cl->p);
  }
  for (uv._4_4_ = 0; uv._4_4_ < (int)(uint)cl->nupvalues; uv._4_4_ = uv._4_4_ + 1) {
    o = cl->upvals[uv._4_4_];
    if ((o != (UpVal *)0x0) && ((o->marked & 0x18) != 0)) {
      reallymarkobject(g,(GCObject *)o);
    }
  }
  return cl->nupvalues + 1;
}

Assistant:

static int traverseLclosure (global_State *g, LClosure *cl) {
  int i;
  markobjectN(g, cl->p);  /* mark its prototype */
  for (i = 0; i < cl->nupvalues; i++) {  /* visit its upvalues */
    UpVal *uv = cl->upvals[i];
    markobjectN(g, uv);  /* mark upvalue */
  }
  return 1 + cl->nupvalues;
}